

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  int iVar5;
  _func_int **pp_Var6;
  MemTable *memtable;
  _func_int *p_Var7;
  long in_RCX;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined1 state [8];
  long in_FS_OFFSET;
  bool bVar10;
  Writer *last_writer;
  Writer w;
  undefined1 local_a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  undefined1 local_98 [8];
  Comparator *pCStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined2 local_78;
  CondVar local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = (pthread_mutex_t *)(options + 200);
  local_88._M_allocated_capacity = 0;
  local_88._8_8_ = 0;
  local_78 = 0;
  port::CondVar::CondVar(&local_70,(Mutex *)&__mutex->__data);
  local_78 = (ushort)*(byte *)&(updates->rep_)._M_dataplus._M_p;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 == 0) {
    local_98 = (undefined1  [8])&local_88;
    std::deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>>::
    emplace_back<leveldb::DBImpl::Writer*>
              ((deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>> *)
               (options + 0x168),(Writer **)local_98);
    if (local_78._1_1_ == '\0') {
      while (&local_88 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)**(long **)(options + 0x178)) {
        local_98 = (undefined1  [8])local_70.mu_;
        pCStack_90._0_1_ = true;
        std::condition_variable::wait((unique_lock *)&local_70);
        local_98 = (undefined1  [8])0x0;
        pCStack_90 = (Comparator *)((ulong)pCStack_90._1_7_ << 8);
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_98);
        if (local_78._1_1_ != '\0') goto LAB_0063c885;
      }
      MakeRoomForWrite(this,SUB81(options,0));
      lVar1 = *(long *)(*(long *)(options + 0x228) + 0x58);
      state = (undefined1  [8])(this->super_DB)._vptr_DB;
      paVar9 = &local_88;
      local_a0 = &local_88;
      if (in_RCX == 0 || state != (undefined1  [8])0x0) goto LAB_0063ca28;
      memtable = (MemTable *)BuildBatchGroup((DBImpl *)options,(Writer **)&local_a0);
      WriteBatchInternal::SetSequence((WriteBatch *)memtable,lVar1 + 1);
      iVar5 = WriteBatchInternal::Count((WriteBatch *)memtable);
      pthread_mutex_unlock(__mutex);
      local_98 = (undefined1  [8])
                 (memtable->comparator_).comparator.super_Comparator._vptr_Comparator;
      pCStack_90 = (memtable->comparator_).comparator.user_comparator_;
      log::Writer::AddRecord((Writer *)local_a8,*(Slice **)(options + 0x158));
      (this->super_DB)._vptr_DB = (_func_int **)local_a8;
      if (local_a8 == (undefined1  [8])0x0) {
        if (*(char *)&(updates->rep_)._M_dataplus._M_p == '\x01') {
          (**(code **)(**(long **)(options + 0x148) + 0x28))(local_98);
          (this->super_DB)._vptr_DB = (_func_int **)local_98;
          bVar10 = local_98 != (undefined1  [8])0x0;
          if (!bVar10) goto LAB_0063c9a9;
        }
        else {
          bVar10 = false;
LAB_0063c9a9:
          WriteBatchInternal::InsertInto((WriteBatch *)local_98,memtable);
          (this->super_DB)._vptr_DB = (_func_int **)local_98;
        }
        state = local_98;
        iVar4 = pthread_mutex_lock(__mutex);
        if (iVar4 != 0) goto LAB_0063cb0b;
        if (bVar10) {
          RecordBackgroundError((DBImpl *)options,(Status *)this);
        }
      }
      else {
        iVar4 = pthread_mutex_lock(__mutex);
        state = local_a8;
        if (iVar4 != 0) goto LAB_0063cb0b;
      }
      if (memtable == *(MemTable **)(options + 0x1b8)) {
        WriteBatch::Clear((WriteBatch *)*(MemTable **)(options + 0x1b8));
      }
      uVar8 = lVar1 + iVar5;
      if (uVar8 < *(ulong *)(*(long *)(options + 0x228) + 0x58)) goto LAB_0063cb29;
      *(ulong *)(*(long *)(options + 0x228) + 0x58) = uVar8;
      paVar9 = local_a0;
LAB_0063ca28:
      do {
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)**(long **)(options + 0x178);
        std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
                  ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                   (options + 0x168));
        if (paVar2 != &local_88) {
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)paVar2->_M_allocated_capacity;
          if ((undefined1  [8])paVar3 != state) {
            if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
              operator_delete__(paVar3);
            }
            if (state == (undefined1  [8])0x0) {
              p_Var7 = (_func_int *)0x0;
            }
            else {
              p_Var7 = (_func_int *)Status::CopyState((char *)state);
            }
            paVar2->_M_allocated_capacity = (size_type)p_Var7;
          }
          paVar2->_M_local_buf[0x11] = '\x01';
          std::condition_variable::notify_one();
        }
      } while (paVar2 != paVar9);
      if (*(long *)(options + 0x198) != *(long *)(options + 0x178)) {
        std::condition_variable::notify_one();
      }
    }
    else {
LAB_0063c885:
      if ((char *)local_88._M_allocated_capacity == (char *)0x0) {
        pp_Var6 = (_func_int **)0x0;
      }
      else {
        pp_Var6 = (_func_int **)Status::CopyState((char *)local_88._M_allocated_capacity);
      }
      (this->super_DB)._vptr_DB = pp_Var6;
    }
    pthread_mutex_unlock(__mutex);
    std::condition_variable::~condition_variable(&local_70.cv_);
    if ((char *)local_88._M_allocated_capacity != (char *)0x0) {
      operator_delete__((void *)local_88._M_allocated_capacity);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (Status)(char *)this;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    iVar4 = std::__throw_system_error(iVar4);
LAB_0063cb0b:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_system_error(iVar4);
LAB_0063cb29:
      __assert_fail("s >= last_sequence_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.h"
                    ,0xd8,"void leveldb::VersionSet::SetLastSequence(uint64_t)");
    }
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);
  uint64_t last_sequence = versions_->LastSequence();
  Writer* last_writer = &w;
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* write_batch = BuildBatchGroup(&last_writer);
    WriteBatchInternal::SetSequence(write_batch, last_sequence + 1);
    last_sequence += WriteBatchInternal::Count(write_batch);

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();
      status = log_->AddRecord(WriteBatchInternal::Contents(write_batch));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(write_batch, mem_);
      }
      mutex_.Lock();
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (write_batch == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}